

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall double_conversion::Bignum::AssignUInt64(Bignum *this,uint64_t value)

{
  Chunk *pCVar1;
  ulong in_RSI;
  Bignum *in_RDI;
  int i;
  int local_14;
  ulong local_10;
  
  Zero(in_RDI);
  local_14 = 0;
  local_10 = in_RSI;
  while (local_10 != 0) {
    pCVar1 = RawBigit(in_RDI,local_14);
    *pCVar1 = (uint)local_10 & 0xfffffff;
    local_10 = local_10 >> 0x1c;
    in_RDI->used_bigits_ = in_RDI->used_bigits_ + 1;
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void Bignum::AssignUInt64(uint64_t value) {
  Zero();
  for(int i = 0; value > 0; ++i) {
    RawBigit(i) = value & kBigitMask;
    value >>= kBigitSize;
    ++used_bigits_;
  }
}